

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.h
# Opt level: O2

void __thiscall
rapidjson::GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator>::
ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
          (GenericReader<rapidjson::UTF8<char>,rapidjson::UTF8<char>,rapidjson::CrtAllocator> *this,
          GenericStringStream<rapidjson::UTF8<char>_> *is,
          GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
          *handler)

{
  byte *pbVar1;
  Ch CVar2;
  byte bVar3;
  byte *pbVar4;
  Ch *pCVar5;
  undefined1 auVar6 [16];
  bool bVar7;
  bool bVar8;
  Ch *pCVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  byte bVar13;
  ulong uVar14;
  ulong i;
  ulong uVar15;
  int iVar16;
  SizeType SVar17;
  uint i_00;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  int iVar21;
  bool bVar22;
  bool bVar23;
  double d;
  undefined1 auVar24 [16];
  undefined1 in_ZMM0 [64];
  undefined1 auVar25 [64];
  undefined1 extraout_var [56];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 in_ZMM3 [64];
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM4_Qb;
  
  CVar2 = *is->src_;
  if (CVar2 == '\"') {
    ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler,false);
    return;
  }
  if (CVar2 == '[') {
    if (*is->src_ != '[') {
      __assert_fail("is.Peek() == \'[\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x327,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::StartArray(handler);
    if (bVar8) {
      SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == ']') {
        is->src_ = is->src_ + 1;
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,0);
        if (bVar8) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x332,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar17 = 1;
        while( true ) {
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pCVar5 = is->src_;
          if (*pCVar5 != ',') break;
          is->src_ = pCVar5 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          SVar17 = SVar17 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pCVar5 != ']') {
          lVar10 = (long)pCVar5 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 7;
          goto LAB_001175c8;
        }
        is->src_ = pCVar5 + 1;
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndArray(handler,SVar17);
        if (bVar8) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x344,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x32b,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseArray(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_001175c8:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (CVar2 == 'f') {
    pCVar5 = is->src_;
    if (*pCVar5 != 'f') {
      __assert_fail("is.Peek() == \'f\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x371,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pCVar9 = pCVar5 + 1;
    is->src_ = pCVar9;
    if (pCVar5[1] == 'a') {
      pCVar9 = pCVar5 + 2;
      is->src_ = pCVar9;
      if (pCVar5[2] == 'l') {
        pCVar9 = pCVar5 + 3;
        is->src_ = pCVar9;
        if (pCVar5[3] == 's') {
          pCVar9 = pCVar5 + 4;
          is->src_ = pCVar9;
          if (pCVar5[4] == 'e') {
            is->src_ = pCVar5 + 5;
            bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::Bool(handler,false);
            if (bVar8) {
              return;
            }
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                            ,0x376,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            lVar10 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 0x10;
            goto LAB_0011716c;
          }
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x379,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseFalse(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)pCVar9 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_0011716c:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (CVar2 == '{') {
    if (*is->src_ != '{') {
      __assert_fail("is.Peek() == \'{\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e3,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    is->src_ = is->src_ + 1;
    bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
            ::StartObject(handler);
    if (bVar8) {
      SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
      if (*(int *)(this + 0x30) != 0) {
        return;
      }
      if (*is->src_ == '}') {
        is->src_ = is->src_ + 1;
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndObject(handler,0);
        if (bVar8) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x2ee,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
      else {
        SVar17 = 1;
        while( true ) {
          if (*is->src_ != '\"') {
            lVar10 = (long)is->src_ - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 4;
            goto LAB_0011742f;
          }
          ParseString<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler,true);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pCVar5 = is->src_;
          if (*pCVar5 != ':') {
            lVar10 = (long)pCVar5 - (long)is->head_;
            *(undefined4 *)(this + 0x30) = 5;
            goto LAB_0011742f;
          }
          is->src_ = pCVar5 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          ParseValue<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
                    (this,is,handler);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
          pCVar5 = is->src_;
          if (*pCVar5 != ',') break;
          is->src_ = pCVar5 + 1;
          SkipWhitespace<rapidjson::GenericStringStream<rapidjson::UTF8<char>>>(is);
          SVar17 = SVar17 + 1;
          if (*(int *)(this + 0x30) != 0) {
            return;
          }
        }
        if (*pCVar5 != '}') {
          lVar10 = (long)pCVar5 - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 6;
          goto LAB_0011742f;
        }
        is->src_ = pCVar5 + 1;
        bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                ::EndObject(handler,SVar17);
        if (bVar8) {
          return;
        }
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x313,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
      }
    }
    else if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x2e7,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseObject(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)is->src_ - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 0x10;
LAB_0011742f:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (CVar2 == 't') {
    pCVar5 = is->src_;
    if (*pCVar5 != 't') {
      __assert_fail("is.Peek() == \'t\'",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x364,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    pCVar9 = pCVar5 + 1;
    is->src_ = pCVar9;
    if (pCVar5[1] == 'r') {
      pCVar9 = pCVar5 + 2;
      is->src_ = pCVar9;
      if (pCVar5[2] == 'u') {
        pCVar9 = pCVar5 + 3;
        is->src_ = pCVar9;
        if (pCVar5[3] == 'e') {
          is->src_ = pCVar5 + 4;
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Bool(handler,true);
          if (bVar8) {
            return;
          }
          if (*(int *)(this + 0x30) != 0) {
            __assert_fail("!HasParseError()",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x369,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          lVar10 = (long)is->src_ - (long)is->head_;
          *(undefined4 *)(this + 0x30) = 0x10;
          goto LAB_00117090;
        }
      }
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x36c,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseTrue(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    lVar10 = (long)pCVar9 - (long)is->head_;
    *(undefined4 *)(this + 0x30) = 3;
LAB_00117090:
    *(long *)(this + 0x38) = lVar10;
    return;
  }
  if (CVar2 == 'n') {
    ParseNull<0u,rapidjson::GenericStringStream<rapidjson::UTF8<char>>,rapidjson::GenericDocument<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,rapidjson::CrtAllocator>>
              (this,is,handler);
    return;
  }
  pbVar4 = is->src_;
  bVar3 = *pbVar4;
  pbVar12 = pbVar4;
  bVar13 = bVar3;
  if (bVar3 == 0x2d) {
    bVar13 = pbVar4[1];
    pbVar12 = pbVar4 + 1;
  }
  pCVar5 = is->head_;
  if (bVar13 == 0x30) {
    uVar19 = (uint)pbVar12[1];
    pbVar11 = pbVar12 + 1;
    auVar25 = ZEXT864(0) << 0x40;
    bVar8 = false;
    i = 0;
    bVar22 = false;
    uVar15 = 0;
    bVar7 = false;
    i_00 = 0;
LAB_0011784e:
    d = auVar25._0_8_;
    iVar16 = 0;
    if ((char)uVar19 == '.') {
      uVar19 = (uint)pbVar11[1];
      pbVar12 = pbVar11 + 1;
      if ((byte)(pbVar11[1] - 0x3a) < 0xf6) {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x627,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xe;
        pbVar11 = pbVar12;
      }
      else {
        iVar21 = 0;
        if (!bVar8) {
          if (!bVar7) {
            i = (ulong)i_00;
          }
          iVar21 = 0;
          while (((0x2f < (byte)uVar19 && ((byte)uVar19 < 0x3a)) && (i >> 0x35 == 0))) {
            pbVar11 = pbVar12 + 1;
            iVar21 = iVar21 + -1;
            pbVar12 = pbVar12 + 1;
            i = (ulong)(uVar19 - 0x30) + i * 10;
            uVar15 = (ulong)((int)uVar15 + (uint)(i != 0));
            uVar19 = (uint)*pbVar11;
          }
          auVar24 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,i);
          auVar25 = ZEXT1664(auVar24);
          bVar22 = true;
        }
        while( true ) {
          d = auVar25._0_8_;
          pbVar11 = pbVar12;
          if ((byte)uVar19 < 0x30) break;
          if (0x39 < (byte)uVar19) goto LAB_00117980;
          auVar24 = auVar25._0_16_;
          if ((int)uVar15 < 0x11) {
            iVar21 = iVar21 + -1;
            auVar27._0_8_ = (double)(int)(uVar19 - 0x30);
            auVar27._8_8_ = in_XMM4_Qb;
            auVar24 = vfmadd231sd_fma(auVar27,auVar24,ZEXT816(0x4024000000000000));
            if (0.0 < auVar24._0_8_) {
              uVar15 = (ulong)((int)uVar15 + 1);
            }
          }
          uVar19 = (uint)pbVar12[1];
          pbVar12 = pbVar12 + 1;
          auVar25 = ZEXT1664(auVar24);
        }
        iVar16 = 0;
        bVar8 = bVar22;
LAB_00117a93:
        if (bVar8 == false) {
          if (bVar7) {
            if (bVar3 == 0x2d) {
              bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::Int64(handler,-i);
            }
            else {
              bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                      ::Uint64(handler,i);
            }
          }
          else if (bVar3 == 0x2d) {
            bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::Int(handler,-i_00);
          }
          else {
            bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                    ::Uint(handler,i_00);
          }
        }
        else {
          auVar25._0_8_ = internal::StrtodNormalPrecision(d,iVar16 + iVar21);
          auVar25._8_56_ = extraout_var;
          if (1.79769313486232e+308 < auVar25._0_8_) {
            if (*(int *)(this + 0x30) != 0) {
              __assert_fail("!HasParseError()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                            ,0x6ab,
                            "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                           );
            }
            *(undefined4 *)(this + 0x30) = 0xd;
            pbVar12 = pbVar4;
            goto LAB_00117ac7;
          }
          auVar6._8_8_ = 0x8000000000000000;
          auVar6._0_8_ = 0x8000000000000000;
          auVar24 = vxorpd_avx512vl(auVar25._0_16_,auVar6);
          bVar8 = GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>
                  ::Double(handler,(double)((ulong)(bVar3 == 0x2d) * auVar24._0_8_ +
                                           (ulong)(bVar3 != 0x2d) * (long)auVar25._0_8_));
        }
        if (bVar8 != false) goto LAB_00117b4f;
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x6c3,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0x10;
        pbVar12 = pbVar4;
      }
    }
    else {
      iVar21 = 0;
LAB_00117980:
      bVar8 = bVar22;
      if ((uVar19 | 0x20) != 0x65) goto LAB_00117a93;
      uVar15 = (ulong)i_00;
      if (bVar7) {
        uVar15 = i;
      }
      bVar8 = true;
      if (bVar22 != false) {
        bVar8 = bVar22;
      }
      bVar13 = pbVar11[1];
      bVar23 = bVar13 != 0x2b;
      if ((bVar23) && (bVar13 != 0x2d)) {
        pbVar12 = pbVar11 + 1;
        bVar23 = false;
      }
      else {
        bVar13 = pbVar11[2];
        pbVar12 = pbVar11 + 2;
      }
      if ((byte)(bVar13 - 0x30) < 10) {
        pbVar11 = pbVar12 + 1;
        iVar18 = bVar13 - 0x30;
        if (bVar23) {
          if (0 < iVar21) {
            __assert_fail("expFrac <= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                          ,0x667,
                          "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                         );
          }
          pbVar12 = pbVar11;
          while (pbVar11 = pbVar12, (byte)(*pbVar11 - 0x30) < 10) {
            iVar18 = iVar18 * 10 + -0x30 + (uint)*pbVar11;
            pbVar12 = pbVar11 + 1;
            if ((iVar21 + 0x7ffffff7) / 10 < iVar18) {
              do {
                pbVar1 = pbVar11 + 1;
                pbVar11 = pbVar11 + 1;
                pbVar12 = pbVar11;
              } while ((byte)(*pbVar1 - 0x30) < 10);
            }
          }
LAB_00117a6c:
          auVar24._8_8_ = in_XMM4_Qb;
          auVar24._0_8_ = in_XMM4_Qa;
          auVar24 = vcvtusi2sd_avx512f(auVar24,uVar15);
          iVar16 = -iVar18;
          if (!bVar23) {
            iVar16 = iVar18;
          }
          d = (double)((ulong)bVar22 * (long)d + (ulong)!bVar22 * auVar24._0_8_);
          goto LAB_00117a93;
        }
        do {
          bVar13 = *pbVar11;
          if (9 < (byte)(bVar13 - 0x30)) goto LAB_00117a6c;
          pbVar11 = pbVar11 + 1;
          iVar18 = iVar18 * 10 + -0x30 + (uint)bVar13;
        } while (iVar18 <= 0x134 - iVar21);
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x677,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xd;
        pbVar12 = pbVar4;
      }
      else {
        if (*(int *)(this + 0x30) != 0) {
          __assert_fail("!HasParseError()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                        ,0x67c,
                        "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                       );
        }
        *(undefined4 *)(this + 0x30) = 0xf;
        pbVar11 = pbVar12;
      }
    }
  }
  else {
    if ((byte)(bVar13 - 0x31) < 9) {
      uVar15 = 0;
      i_00 = bVar13 - 0x30;
      if (bVar3 == 0x2d) {
LAB_001176c9:
        bVar13 = pbVar12[uVar15 + 1];
        uVar20 = (ulong)bVar13;
        if (9 < (byte)(bVar13 - 0x30)) goto LAB_0011779f;
        if (i_00 < 0xccccccc) {
LAB_001176e2:
          uVar15 = uVar15 + 1;
          i_00 = i_00 * 10 + -0x30 + (uint)bVar13;
          goto LAB_001176c9;
        }
        uVar19 = i_00;
        if (i_00 != 0xccccccc) goto LAB_00117746;
        if (bVar13 < 0x39) goto LAB_001176e2;
        uVar20 = 0x39;
        uVar19 = 0xccccccc;
LAB_00117746:
        i_00 = uVar19;
        pbVar11 = pbVar12 + uVar15 + 1;
        i = (ulong)i_00;
        if (bVar3 == 0x2d) {
          while( true ) {
            uVar19 = (uint)uVar20;
            if (9 < (byte)((byte)uVar20 - 0x30)) break;
            if ((0xccccccccccccccb < i) && (0x38 < (byte)uVar20 || i != 0xccccccccccccccc))
            goto LAB_00117801;
            uVar15 = (ulong)((int)uVar15 + 1);
            uVar14 = uVar20 & 0xf;
            uVar20 = (ulong)pbVar11[1];
            pbVar11 = pbVar11 + 1;
            i = uVar14 + i * 10;
          }
        }
        else {
          while( true ) {
            uVar19 = (uint)uVar20;
            if (9 < (byte)((byte)uVar20 - 0x30)) break;
            if ((0x1999999999999998 < i) && (0x35 < (byte)uVar20 || i != 0x1999999999999999))
            goto LAB_00117801;
            uVar15 = (ulong)((int)uVar15 + 1);
            uVar14 = uVar20 & 0xf;
            uVar20 = (ulong)pbVar11[1];
            pbVar11 = pbVar11 + 1;
            i = uVar14 + i * 10;
          }
        }
        auVar25 = ZEXT864(0);
        bVar7 = true;
        bVar8 = false;
        bVar22 = false;
      }
      else {
        while( true ) {
          bVar13 = pbVar12[uVar15 + 1];
          uVar20 = (ulong)bVar13;
          if (9 < (byte)(bVar13 - 0x30)) break;
          if ((0x19999998 < i_00) &&
             ((uVar19 = i_00, i_00 != 0x19999999 || (uVar19 = 0x19999999, 0x35 < bVar13))))
          goto LAB_00117746;
          uVar15 = uVar15 + 1;
          i_00 = i_00 * 10 + -0x30 + (uint)bVar13;
        }
LAB_0011779f:
        uVar19 = (uint)bVar13;
        pbVar11 = pbVar12 + uVar15 + 1;
        auVar25 = ZEXT864(0);
        bVar8 = false;
        i = 0;
        bVar22 = false;
        bVar7 = false;
      }
      goto LAB_0011784e;
    }
    if (*(int *)(this + 0x30) != 0) {
      __assert_fail("!HasParseError()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/rapidjson/include/rapidjson/reader.h"
                    ,0x5fc,
                    "void rapidjson::GenericReader<rapidjson::UTF8<>, rapidjson::UTF8<>>::ParseNumber(InputStream &, Handler &) [SourceEncoding = rapidjson::UTF8<>, TargetEncoding = rapidjson::UTF8<>, StackAllocator = rapidjson::CrtAllocator, parseFlags = 0U, InputStream = rapidjson::GenericStringStream<rapidjson::UTF8<>>, Handler = rapidjson::GenericDocument<rapidjson::UTF8<>>]"
                   );
    }
    *(undefined4 *)(this + 0x30) = 3;
    pbVar11 = pbVar12;
  }
LAB_00117ac7:
  *(long *)(this + 0x38) = (long)pbVar12 - (long)pCVar5;
LAB_00117b4f:
  is->src_ = pbVar11;
  is->head_ = pCVar5;
  return;
LAB_00117801:
  auVar24 = vcvtusi2sd_avx512f(in_ZMM0._0_16_,i);
  while( true ) {
    uVar19 = (uint)uVar20;
    auVar25 = ZEXT1664(auVar24);
    if (9 < (byte)((char)uVar20 - 0x30U)) break;
    uVar20 = (ulong)pbVar11[1];
    pbVar11 = pbVar11 + 1;
    auVar26._0_8_ = (double)(int)(uVar19 - 0x30);
    auVar26._8_8_ = in_ZMM3._8_8_;
    auVar24 = vfmadd231sd_fma(auVar26,auVar24,ZEXT816(0x4024000000000000));
  }
  bVar8 = true;
  bVar22 = true;
  bVar7 = true;
  goto LAB_0011784e;
}

Assistant:

Ch Peek() const { return *src_; }